

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O3

void __thiscall
EncoderMD::FixMaps(EncoderMD *this,uint32 brOffset,uint32 bytesSaved,FixUpMapIndex *mapIndices)

{
  uint uVar1;
  List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_03;
  uint32 *puVar2;
  Type *ppIVar3;
  Type *pTVar4;
  Type *ppPVar5;
  Type *pTVar6;
  Encoder *pEVar7;
  uint uVar8;
  uint32 uVar9;
  
  pEVar7 = this->m_encoder;
  this_00 = pEVar7->m_inlineeFrameRecords;
  uVar9 = mapIndices->inlineeFrameRecordsIndex;
  if ((int)uVar9 <
      (this_00->super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count) {
    do {
      ppIVar3 = JsUtil::
                List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,uVar9);
      if (brOffset < (*ppIVar3)->inlineeStartOffset) break;
      ppIVar3 = JsUtil::
                List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,uVar9);
      (*ppIVar3)->inlineeStartOffset = (*ppIVar3)->inlineeStartOffset - bytesSaved;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 <
             (this_00->
             super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>).
             count);
    pEVar7 = this->m_encoder;
  }
  mapIndices->inlineeFrameRecordsIndex = uVar9;
  this_01 = pEVar7->m_inlineeFrameMap;
  uVar9 = mapIndices->inlineeFrameMapIndex;
  if ((int)uVar9 <
      (this_01->
      super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>).
      count) {
    do {
      pTVar4 = JsUtil::
               List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,uVar9);
      if (brOffset < pTVar4->offset) break;
      pTVar4 = JsUtil::
               List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,uVar9);
      pTVar4->offset = pTVar4->offset - bytesSaved;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 <
             (this_01->
             super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
             ).count);
    pEVar7 = this->m_encoder;
  }
  mapIndices->inlineeFrameMapIndex = uVar9;
  this_02 = pEVar7->m_pragmaInstrToRecordOffset;
  uVar9 = mapIndices->pragmaInstToRecordOffsetIndex;
  if ((int)uVar9 <
      (this_02->super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count) {
    do {
      ppPVar5 = JsUtil::
                List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,uVar9);
      if (brOffset < (*ppPVar5)->m_offsetInBuffer) break;
      ppPVar5 = JsUtil::
                List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,uVar9);
      (*ppPVar5)->m_offsetInBuffer = (*ppPVar5)->m_offsetInBuffer - bytesSaved;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 <
             (this_02->
             super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>).count);
    pEVar7 = this->m_encoder;
  }
  mapIndices->pragmaInstToRecordOffsetIndex = uVar9;
  this_03 = pEVar7->m_sortedLazyBailoutRecordList;
  uVar9 = mapIndices->lazyBailOutRecordListIndex;
  if ((int)uVar9 <
      (this_03->super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).
      count) {
    do {
      pTVar6 = JsUtil::
               List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_03,uVar9);
      if (brOffset < pTVar6->offset) break;
      pTVar6 = JsUtil::
               List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_03,uVar9);
      pTVar6->offset = pTVar6->offset - bytesSaved;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 <
             (this_03->
             super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).count);
    pEVar7 = this->m_encoder;
  }
  mapIndices->lazyBailOutRecordListIndex = uVar9;
  uVar8 = mapIndices->offsetBuffIndex;
  if (uVar8 < pEVar7->m_instrNumber) {
    puVar2 = pEVar7->m_offsetBuffer;
    do {
      uVar1 = puVar2[(int)uVar8];
      if (brOffset < uVar1) break;
      puVar2[(int)uVar8] = uVar1 - bytesSaved;
      uVar8 = uVar8 + 1;
    } while (uVar8 < pEVar7->m_instrNumber);
  }
  mapIndices->offsetBuffIndex = uVar8;
  return;
}

Assistant:

void
EncoderMD::FixMaps(uint32 brOffset, uint32 bytesSaved, FixUpMapIndex *mapIndices)

{
    int32 i;

    {
        InlineeFrameRecords *recList = m_encoder->m_inlineeFrameRecords;
        for (i = mapIndices->inlineeFrameRecordsIndex; i < recList->Count() && recList->Item(i)->inlineeStartOffset <= brOffset; i++)
        {
            recList->Item(i)->inlineeStartOffset -= bytesSaved;
        }

        mapIndices->inlineeFrameRecordsIndex = i;
    }

    {
        ArenaInlineeFrameMap *mapList = m_encoder->m_inlineeFrameMap;
        for (i = mapIndices->inlineeFrameMapIndex; i < mapList->Count() && mapList->Item(i).offset <= brOffset; i++)
        {
            mapList->Item(i).offset -= bytesSaved;
        }

        mapIndices->inlineeFrameMapIndex = i;
    }

    {
        PragmaInstrList *pInstrList = m_encoder->m_pragmaInstrToRecordOffset;
        for (i = mapIndices->pragmaInstToRecordOffsetIndex; i < pInstrList->Count() && pInstrList->Item(i)->m_offsetInBuffer <= brOffset; i++)
        {
            pInstrList->Item(i)->m_offsetInBuffer -= bytesSaved;
        }

        mapIndices->pragmaInstToRecordOffsetIndex = i;
    }

    {
        ArenaLazyBailoutRecordList *lazyBailOutRecordList = m_encoder->m_sortedLazyBailoutRecordList;
        for (i = mapIndices->lazyBailOutRecordListIndex; i < lazyBailOutRecordList->Count() && lazyBailOutRecordList->Item(i).offset <= brOffset; i++)
        {
            lazyBailOutRecordList->Item(i).offset -= bytesSaved;
        }

        mapIndices->lazyBailOutRecordListIndex = i;
    }

#if DBG_DUMP

    {
        for (i = mapIndices->offsetBuffIndex; (uint)i < m_encoder->m_instrNumber && m_encoder->m_offsetBuffer[i] <= brOffset; i++)
        {
            m_encoder->m_offsetBuffer[i] -= bytesSaved;
        }

        mapIndices->offsetBuffIndex = i;
    }

#endif
}